

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O1

int LowMC_test_vector_256_256_38_1(void)

{
  int iVar1;
  uint8_t ciphertext_expected [32];
  uint8_t plaintext [32];
  uint8_t key [32];
  uint8_t local_68 [104];
  
  local_68[0x40] = 0x80;
  local_68[0x41] = '\0';
  local_68[0x42] = '\0';
  local_68[0x43] = '\0';
  local_68[0x44] = '\0';
  local_68[0x45] = '\0';
  local_68[0x46] = '\0';
  local_68[0x47] = '\0';
  local_68[0x48] = '\0';
  local_68[0x49] = '\0';
  local_68[0x4a] = '\0';
  local_68[0x4b] = '\0';
  local_68[0x4c] = '\0';
  local_68[0x4d] = '\0';
  local_68[0x4e] = '\0';
  local_68[0x4f] = '\0';
  local_68[0x50] = '\0';
  local_68[0x51] = '\0';
  local_68[0x52] = '\0';
  local_68[0x53] = '\0';
  local_68[0x54] = '\0';
  local_68[0x55] = '\0';
  local_68[0x56] = '\0';
  local_68[0x57] = '\0';
  local_68[0x58] = '\0';
  local_68[0x59] = '\0';
  local_68[0x5a] = '\0';
  local_68[0x5b] = '\0';
  local_68[0x5c] = '\0';
  local_68[0x5d] = '\0';
  local_68[0x5e] = '\0';
  local_68[0x5f] = '\0';
  local_68[0x20] = 0xab;
  local_68[0x21] = 0xff;
  local_68[0x22] = '\0';
  local_68[0x23] = '\0';
  local_68[0x24] = '\0';
  local_68[0x25] = '\0';
  local_68[0x26] = '\0';
  local_68[0x27] = '\0';
  local_68[0x28] = '\0';
  local_68[0x29] = '\0';
  local_68[0x2a] = '\0';
  local_68[0x2b] = '\0';
  local_68[0x2c] = '\0';
  local_68[0x2d] = '\0';
  local_68[0x2e] = '\0';
  local_68[0x2f] = '\0';
  local_68[0x30] = '\0';
  local_68[0x31] = '\0';
  local_68[0x32] = '\0';
  local_68[0x33] = '\0';
  local_68[0x34] = '\0';
  local_68[0x35] = '\0';
  local_68[0x36] = '\0';
  local_68[0x37] = '\0';
  local_68[0x38] = '\0';
  local_68[0x39] = '\0';
  local_68[0x3a] = '\0';
  local_68[0x3b] = '\0';
  local_68[0x3c] = '\0';
  local_68[0x3d] = '\0';
  local_68[0x3e] = '\0';
  local_68[0x3f] = '\0';
  local_68[0] = 0xb8;
  local_68[1] = 0xf2;
  local_68[2] = '\n';
  local_68[3] = 0x88;
  local_68[4] = 0x8a;
  local_68[5] = '\n';
  local_68[6] = 0x9e;
  local_68[7] = 0xc4;
  local_68[8] = 0xe4;
  local_68[9] = 0x95;
  local_68[10] = 0xf1;
  local_68[0xb] = 0xfb;
  local_68[0xc] = 'C';
  local_68[0xd] = 0x9a;
  local_68[0xe] = 0xbd;
  local_68[0xf] = 0xde;
  local_68[0x10] = '\x18';
  local_68[0x11] = 0xc1;
  local_68[0x12] = 0xd3;
  local_68[0x13] = 0xd2;
  local_68[0x14] = 0x9c;
  local_68[0x15] = 0xf2;
  local_68[0x16] = '\r';
  local_68[0x17] = 0xf4;
  local_68[0x18] = 0xb1;
  local_68[0x19] = '\n';
  local_68[0x1a] = 'V';
  local_68[0x1b] = 'z';
  local_68[0x1c] = 0xa0;
  local_68[0x1d] = ',';
  local_68[0x1e] = 'r';
  local_68[0x1f] = 'g';
  iVar1 = lowmc_enc(&parameters_256_256_38,local_68 + 0x40,local_68 + 0x20,local_68);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_256_256_38_1(void) {
  const uint8_t key[32]       = {0x80, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                           0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t plaintext[32] = {0xAB, 0xFF, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                                 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
  const uint8_t ciphertext_expected[32] = {0xB8, 0xF2, 0x0A, 0x88, 0x8A, 0x0A, 0x9E, 0xC4,
                                           0xE4, 0x95, 0xF1, 0xFB, 0x43, 0x9A, 0xBD, 0xDE,
                                           0x18, 0xC1, 0xD3, 0xD2, 0x9C, 0xF2, 0x0D, 0xF4,
                                           0xB1, 0x0A, 0x56, 0x7A, 0xA0, 0x2C, 0x72, 0x67};

  return lowmc_enc(&parameters_256_256_38, key, plaintext, ciphertext_expected);
}